

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O2

void gen_xsxexpqp(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 dst;
  uintptr_t o;
  uintptr_t o_2;
  uintptr_t o_1;
  
  if (ctx->vsx_enabled != false) {
    tcg_ctx = ctx->uc->tcg_ctx;
    ret = tcg_temp_new_i64(tcg_ctx);
    ret_00 = tcg_temp_new_i64(tcg_ctx);
    dst = tcg_temp_new_i64(tcg_ctx);
    get_cpu_vsrh(tcg_ctx,dst,ctx->opcode >> 0xb & 0x1f | 0x20);
    tcg_gen_extract_i64_ppc64(tcg_ctx,ret,dst,0x30,0xf);
    set_cpu_vsrh(tcg_ctx,ctx->opcode >> 0x15 & 0x1f | 0x20,ret);
    tcg_gen_movi_i64_ppc64(tcg_ctx,ret_00,0);
    set_cpu_vsrl(tcg_ctx,ctx->opcode >> 0x15 & 0x1f | 0x20,ret_00);
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(dst + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
    return;
  }
  gen_exception(ctx,0x5e);
  return;
}

Assistant:

static void gen_xsxexpqp(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 xth;
    TCGv_i64 xtl;
    TCGv_i64 xbh;

    if (unlikely(!ctx->vsx_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VSXU);
        return;
    }
    xth = tcg_temp_new_i64(tcg_ctx);
    xtl = tcg_temp_new_i64(tcg_ctx);
    xbh = tcg_temp_new_i64(tcg_ctx);
    get_cpu_vsrh(tcg_ctx, xbh, rB(ctx->opcode) + 32);

    tcg_gen_extract_i64(tcg_ctx, xth, xbh, 48, 15);
    set_cpu_vsrh(tcg_ctx, rD(ctx->opcode) + 32, xth);
    tcg_gen_movi_i64(tcg_ctx, xtl, 0);
    set_cpu_vsrl(tcg_ctx, rD(ctx->opcode) + 32, xtl);

    tcg_temp_free_i64(tcg_ctx, xbh);
    tcg_temp_free_i64(tcg_ctx, xth);
    tcg_temp_free_i64(tcg_ctx, xtl);
}